

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

void __thiscall cmMakefile::SetIncludeRegularExpression(cmMakefile *this,char *regex)

{
  allocator local_39;
  string local_38;
  char *local_18;
  char *regex_local;
  cmMakefile *this_local;
  
  local_18 = regex;
  regex_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"INCLUDE_REGULAR_EXPRESSION",&local_39);
  SetProperty(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void SetIncludeRegularExpression(const char* regex)
  {
    this->SetProperty("INCLUDE_REGULAR_EXPRESSION", regex);
  }